

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O1

int util::variant::int_length(int x)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 1;
  if (x != 0) {
    uVar2 = -x;
    if (0 < x) {
      uVar2 = x;
    }
    if (-1 < (int)uVar2) {
      uVar3 = (uint)x >> 0x1f;
      do {
        uVar3 = uVar3 + 1;
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
      } while (bVar1);
    }
  }
  return uVar3;
}

Assistant:

int variant::int_length(int x)
{
	int count = 0;

	if (x == 0)
		return 1;

	if (x < 0)
	{
		x = -x;
		++count;
	}

	if (x < 0)
	{
		return 1;
	}

	while (x > 0)
	{
		x /= 10;
		++count;
	}

	return count;
}